

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O1

Index __thiscall wasm::Builder::addVar(Builder *this,Function *func,Name name,Type type)

{
  iterator __position;
  Index IVar1;
  mapped_type *pmVar2;
  mapped_type *pmVar3;
  undefined1 auStack_40 [8];
  Name name_local;
  Type type_local;
  Index index;
  
  name_local.super_IString.str._M_str = name.super_IString.str._M_str;
  name_local.super_IString.str._M_len = name.super_IString.str._M_len;
  auStack_40 = (undefined1  [8])func;
  if ((char *)0x1 < name_local.super_IString.str._M_str) {
    IVar1 = ::wasm::Function::getNumLocals();
    type_local.id._4_4_ = IVar1;
    if (name_local.super_IString.str._M_len != 0) {
      pmVar2 = std::__detail::
               _Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)(this + 0x15),(key_type *)auStack_40);
      *pmVar2 = IVar1;
      pmVar3 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)(this + 0xe),(key_type *)((long)&type_local.id + 4));
      (pmVar3->super_IString).str._M_len = (size_t)auStack_40;
      (pmVar3->super_IString).str._M_str = (char *)name_local.super_IString.str._M_len;
    }
    __position._M_current = (Type *)this[10].wasm;
    if ((Module *)__position._M_current == this[0xb].wasm) {
      std::vector<wasm::Type,std::allocator<wasm::Type>>::_M_realloc_insert<wasm::Type&>
                ((vector<wasm::Type,std::allocator<wasm::Type>> *)(this + 9),__position,
                 (Type *)&name_local.super_IString.str._M_str);
    }
    else {
      (__position._M_current)->id = (uintptr_t)name_local.super_IString.str._M_str;
      this[10].wasm = (Module *)(__position._M_current + 1);
    }
    return type_local.id._4_4_;
  }
  __assert_fail("type.isConcrete()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-builder.h"
                ,0x4ca,"static Index wasm::Builder::addVar(Function *, Name, Type)");
}

Assistant:

static Index addVar(Function* func, Name name, Type type) {
    // always ok to add a var, it does not affect other indices
    assert(type.isConcrete());
    Index index = func->getNumLocals();
    if (name.is()) {
      func->localIndices[name] = index;
      func->localNames[index] = name;
    }
    func->vars.emplace_back(type);
    return index;
  }